

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QLocaleData::applyIntegerFormatting
          (QLocaleData *this,QString *numStr,bool negative,int precision,int base,int width,
          uint flags)

{
  qsizetype qVar1;
  qsizetype qVar2;
  anon_class_32_4_a1af1fd6 *this_00;
  QString *in_RDX;
  QString *in_RSI;
  QLocaleData *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  GroupSizes GVar3;
  int in_stack_00000008;
  uint in_stack_00000010;
  qsizetype i_2;
  qsizetype i_1;
  bool noPrecision;
  qsizetype i;
  qsizetype usedWidth;
  qsizetype digitCount;
  qsizetype digitWidth;
  QString *result;
  char16_t *str;
  QString group;
  GroupSizes grouping;
  QString prefix;
  QStringView basePrefix;
  QString zero;
  QStringBuilder<QString,_const_QStringView_&> *in_stack_fffffffffffffe68;
  QLocaleData *pQVar4;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  QString *in_stack_fffffffffffffe90;
  QLocaleData *in_stack_fffffffffffffe98;
  long local_158;
  long local_150;
  anon_class_32_4_a1af1fd6 *paVar5;
  int local_130;
  int local_d8;
  int local_d0;
  int iStack_cc;
  QString local_88;
  undefined1 *local_70;
  int *local_68;
  QString *local_58;
  QStringView local_50;
  QArrayDataPointer<char16_t> local_40;
  QString local_28;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = in_RDI;
  local_c = in_R9D;
  if (in_R9D == 10) {
    zeroDigit((QLocaleData *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_40,(Data *)0x0,L"0",1);
    QString::QString((QString *)in_RDI,(DataPointer *)in_stack_fffffffffffffe68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RDI);
  }
  qVar1 = QString::size(&local_28);
  qVar2 = QString::size(in_RDX);
  this_00 = (anon_class_32_4_a1af1fd6 *)(qVar2 / qVar1);
  local_50.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_50.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_70 = (undefined1 *)&stack0x00000010;
  local_68 = &local_c;
  local_58 = &local_28;
  local_50 = applyIntegerFormatting::anon_class_32_4_a1af1fd6::operator()(this_00);
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  signPrefix(in_stack_fffffffffffffe98,SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0),
             (uint)in_stack_fffffffffffffe90);
  ::operator+((QString *)pQVar4,(QStringView *)in_RDI);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe68);
  QStringBuilder<QString,_const_QStringView_&>::~QStringBuilder
            ((QStringBuilder<QString,_const_QStringView_&> *)0x1c87d5);
  QString::~QString((QString *)0x1c87e2);
  paVar5 = this_00;
  qVar1 = QString::size(&local_88);
  local_150 = (long)&this_00->flags + qVar1;
  if ((local_c == 10) && ((in_stack_00000010 & 0x20) != 0)) {
    GVar3 = groupSizes(pQVar4);
    local_d8 = GVar3.least;
    groupSeparator((QLocaleData *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    local_158 = (long)paVar5 - (long)local_d8;
    local_d0 = GVar3.first;
    if (local_d0 <= local_158) {
      QString::insert(in_stack_fffffffffffffe90,
                      CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),in_RSI);
      while( true ) {
        local_150 = local_150 + 1;
        iStack_cc = GVar3.higher;
        local_158 = local_158 - iStack_cc;
        if (local_158 < 1) break;
        QString::insert(in_stack_fffffffffffffe90,
                        CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),in_RSI);
      }
    }
    QString::~QString((QString *)0x1c8964);
  }
  local_130 = in_R8D;
  if (in_R8D == -1) {
    local_130 = 1;
  }
  for (qVar1 = QString::size(in_RDX); qVar1 < local_130; qVar1 = qVar1 + 1) {
    QString::prepend((QString *)in_RDI,(QString *)this_00);
    local_150 = local_150 + 1;
  }
  if (((in_R8D == -1) && ((in_stack_00000010 & 2) != 0)) && ((in_stack_00000010 & 4) == 0)) {
    for (; local_150 < in_stack_00000008; local_150 = local_150 + 1) {
      QString::prepend((QString *)in_RDI,(QString *)this_00);
    }
  }
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->m_midListPattern_idx = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->m_decimalSeparator_idx = &DAT_aaaaaaaaaaaaaaaa;
  if ((in_stack_00000010 & 0x40) == 0) {
    QString::QString((QString *)in_RDI,(QString *)this_00);
  }
  else {
    QString::toUpper((QString *)this_00);
  }
  qVar1 = QString::size(&local_88);
  if (qVar1 != 0) {
    QString::prepend((QString *)in_RDI,(QString *)this_00);
  }
  QString::~QString((QString *)0x1c8ad5);
  QString::~QString((QString *)0x1c8ae2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocaleData::applyIntegerFormatting(QString &&numStr, bool negative, int precision,
                                            int base, int width, unsigned flags) const
{
    const QString zero = base == 10 ? zeroDigit() : QStringLiteral("0");
    const auto digitWidth = zero.size();
    const auto digitCount = numStr.size() / digitWidth;

    const auto basePrefix = [&] () -> QStringView {
        if (flags & ShowBase) {
            const bool upper = flags & UppercaseBase;
            if (base == 16)
                return upper ? u"0X" : u"0x";
            if (base == 2)
                return upper ? u"0B" : u"0b";
            if (base == 8 && !numStr.startsWith(zero))
                return zero;
        }
        return {};
    }();

    const QString prefix = signPrefix(negative, flags) + basePrefix;
    // Count how much of width we've used up.  Each digit counts as one
    qsizetype usedWidth = digitCount + prefix.size();

    if (base == 10 && flags & GroupDigits) {
        const QLocaleData::GroupSizes grouping = groupSizes();
        const QString group = groupSeparator();
        qsizetype i = digitCount - grouping.least;
        if (i >= grouping.first) {
            numStr.insert(i * digitWidth, group);
            ++usedWidth;
            while ((i -= grouping.higher) > 0) {
                numStr.insert(i * digitWidth, group);
                ++usedWidth;
            }
        }
        // TODO: should we group any zero-padding we add later ?
    }

    const bool noPrecision = precision == -1;
    if (noPrecision)
        precision = 1;

    for (qsizetype i = numStr.size(); i < precision; ++i) {
        numStr.prepend(zero);
        usedWidth++;
    }

    // LeftAdjusted overrides ZeroPadded; and sprintf() only pads when
    // precision is not specified in the format string.
    if (noPrecision && flags & ZeroPadded && !(flags & LeftAdjusted)) {
        for (qsizetype i = usedWidth; i < width; ++i)
            numStr.prepend(zero);
    }

    QString result(flags & CapitalEorX ? std::move(numStr).toUpper() : std::move(numStr));
    if (prefix.size())
        result.prepend(prefix);
    return result;
}